

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::init<Kernel::TypedTermList>
          (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
                 *parent,Node *root,TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  long *plVar1;
  BacktrackData ***pppBVar2;
  BacktrackData **ppBVar3;
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
  local_48;
  
  Kernel::RobSubstitution::reset((RobSubstitution *)this);
  this->_retrieveSubstitution = retrieveSubstitution;
  local_48._isSome = false;
  local_48._1_7_ = 0;
  local_48._elem._elem = (Value)0x0;
  Lib::
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
  ::operator=(&(this->_leafData).
               super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
              ,&local_48);
  if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
    plVar1 = (long *)((long)local_48._elem._elem + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_48._elem._elem + 8))();
    }
  }
  this->_normalizationRecording = false;
  if (root != (Node *)0x0) {
    ppBVar3 = (this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    if (ppBVar3 == (this->_algo)._subs.super_Backtrackable._bdStack._end) {
      Lib::Stack<Lib::BacktrackData_*>::expand((Stack<Lib::BacktrackData_*> *)this);
      ppBVar3 = (this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    }
    *ppBVar3 = &this->_queryInitBacktrackData;
    pppBVar2 = &(this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    *pppBVar2 = *pppBVar2 + 1;
    Kernel::RobSubstitution::bindSpecialVar
              ((RobSubstitution *)this,0,2,query.super_TermList._content,0);
    Kernel::RobSubstitution::bindSpecialVar
              ((RobSubstitution *)this,1,2,(uint64_t)query._sort._content,0);
    pppBVar2 = &(this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    *pppBVar2 = *pppBVar2 + -1;
    prepareChildren(this,root,false);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args) {
        _algo.init(std::move(args)...);
        _retrieveSubstitution = retrieveSubstitution;
        _leafData = {};
        _normalizationRecording = false;
        _iterCntr = InstanceCntr(parent->_iterCnt);

#define DEBUG_QUERY(lvl, ...) if (lvl < 0) DBG(__VA_ARGS__)
        if(!root) {
          return;
        }

        _algo.bdRecord(_queryInitBacktrackData);
        parent->createBindings(query, reversed, 
            [&](unsigned var, TermList t) { _algo.bindQuerySpecialVar(var, t); });
        DEBUG_QUERY(1, "query: ", _algo)
        _algo.bdDone();


        prepareChildren(root, /* backtrackable */ false);
      }